

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyParserNumber.cpp
# Opt level: O0

bool __thiscall
Rml::PropertyParserNumber::ParseValue
          (PropertyParserNumber *this,Property *property,String *value,ParameterMap *param_3)

{
  char x;
  bool bVar1;
  Units units;
  char *pcVar2;
  Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Unit,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pTVar3;
  pointer ppVar4;
  const_iterator cVar5;
  float local_11c;
  Variant local_118;
  Units local_ec;
  undefined1 auStack_e8 [4];
  Unit unit;
  uint8_t *local_e0;
  undefined1 local_d8 [8];
  const_iterator it;
  char *pcStack_c0;
  float float_value;
  char *str_end;
  String local_a8;
  undefined1 local_88 [8];
  String str_unit;
  String str_number;
  long lStack_40;
  char c;
  size_t i;
  size_t unit_pos;
  ParameterMap *param_3_local;
  String *value_local;
  Property *property_local;
  PropertyParserNumber *this_local;
  
  lStack_40 = ::std::__cxx11::string::size();
  while (lStack_40 != 0) {
    pcVar2 = (char *)::std::__cxx11::string::operator[]((ulong)value);
    x = *pcVar2;
    if ((('/' < x) && (x < ':')) ||
       (bVar1 = StringUtilities::IsWhitespace(x), lStack_40 = lStack_40 + -1, bVar1)) break;
  }
  ::std::__cxx11::string::substr((ulong)((long)&str_unit.field_2 + 8),(ulong)value);
  ::std::__cxx11::string::substr((ulong)&local_a8,(ulong)value);
  StringUtilities::ToLower((String *)local_88,&local_a8);
  ::std::__cxx11::string::~string((string *)&local_a8);
  pcStack_c0 = (char *)0x0;
  pcVar2 = (char *)::std::__cxx11::string::c_str();
  it.mInfo._4_4_ = strtof(pcVar2,&stack0xffffffffffffff40);
  pcVar2 = (char *)::std::__cxx11::string::c_str();
  if (pcVar2 == pcStack_c0) {
    this_local._7_1_ = false;
  }
  else {
    pTVar3 = &ControlledLifetimeResource<Rml::PropertyParserNumberData>::operator->
                        ((ControlledLifetimeResource<Rml::PropertyParserNumberData> *)parser_data)->
              unit_string_map;
    cVar5 = robin_hood::detail::
            Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Unit,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(pTVar3,(key_type *)local_88);
    it.mKeyVals = (NodePtr)cVar5.mInfo;
    local_d8 = (undefined1  [8])cVar5.mKeyVals;
    pTVar3 = &ControlledLifetimeResource<Rml::PropertyParserNumberData>::operator->
                        ((ControlledLifetimeResource<Rml::PropertyParserNumberData> *)parser_data)->
              unit_string_map;
    _auStack_e8 = robin_hood::detail::
                  Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Unit,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end(pTVar3);
    bVar1 = robin_hood::detail::
            Table<true,80ul,std::__cxx11::string,Rml::Unit,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
            ::Iter<true>::operator==((Iter<true> *)local_d8,(Iter<true> *)auStack_e8);
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else {
      ppVar4 = robin_hood::detail::
               Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Unit,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::Iter<true>::operator->((Iter<true> *)local_d8);
      local_ec = ppVar4->second;
      units = operator&(local_ec,this->units);
      bVar1 = Any(units);
      if (bVar1) {
        Variant::operator=(&property->value,(float *)((long)&it.mInfo + 4));
        property->unit = local_ec;
        this_local._7_1_ = true;
      }
      else if (((local_ec != NUMBER) || (this->zero_unit == UNKNOWN)) ||
              ((it.mInfo._4_4_ != 0.0 || (NAN(it.mInfo._4_4_))))) {
        this_local._7_1_ = false;
      }
      else {
        property->unit = this->zero_unit;
        local_11c = 0.0;
        Variant::Variant<float,void>(&local_118,&local_11c);
        Variant::operator=(&property->value,&local_118);
        Variant::~Variant(&local_118);
        this_local._7_1_ = true;
      }
    }
  }
  it.mInfo._0_4_ = 1;
  ::std::__cxx11::string::~string((string *)local_88);
  ::std::__cxx11::string::~string((string *)(str_unit.field_2._M_local_buf + 8));
  return this_local._7_1_;
}

Assistant:

bool PropertyParserNumber::ParseValue(Property& property, const String& value, const ParameterMap& /*parameters*/) const
{
	// Find the beginning of the unit string in 'value'.
	size_t unit_pos = 0;
	for (size_t i = value.size(); i--;)
	{
		const char c = value[i];
		if ((c >= '0' && c <= '9') || StringUtilities::IsWhitespace(c))
		{
			unit_pos = i + 1;
			break;
		}
	}

	String str_number = value.substr(0, unit_pos);
	String str_unit = StringUtilities::ToLower(value.substr(unit_pos));

	char* str_end = nullptr;
	float float_value = strtof(str_number.c_str(), &str_end);
	if (str_number.c_str() == str_end)
	{
		// Number conversion failed
		return false;
	}

	const auto it = parser_data->unit_string_map.find(str_unit);
	if (it == parser_data->unit_string_map.end())
	{
		// Invalid unit name
		return false;
	}

	const Unit unit = it->second;

	if (Any(unit & units))
	{
		property.value = float_value;
		property.unit = unit;
		return true;
	}

	// Detected unit not allowed.
	// However, we allow a value of "0" if zero_unit is set and no unit specified (that is, unit is a pure NUMBER).
	if (unit == Unit::NUMBER)
	{
		if (zero_unit != Unit::UNKNOWN && float_value == 0.0f)
		{
			property.unit = zero_unit;
			property.value = Variant(0.0f);
			return true;
		}
	}

	return false;
}